

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O3

TabletPointData * QGuiApplicationPrivate::tabletDevicePoint(qint64 deviceId)

{
  pointer pTVar1;
  iterator iVar2;
  TabletPointData *pTVar3;
  qsizetype i;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  TabletPointData local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (tabletDevicePoints.d.size == 0) {
    i = 0;
  }
  else {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pTVar1 = QList<QGuiApplicationPrivate::TabletPointData>::data(&tabletDevicePoints);
      if (*(long *)((long)&pTVar1->deviceId + lVar5) == deviceId) {
        pTVar3 = (TabletPointData *)((long)&pTVar1->deviceId + lVar5);
        goto LAB_002d6b75;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
      i = tabletDevicePoints.d.size;
    } while (uVar4 < (ulong)tabletDevicePoints.d.size);
  }
  local_40.state.super_QFlagsStorageHelper<Qt::MouseButton,_4>.super_QFlagsStorage<Qt::MouseButton>.
  i = (QFlagsStorageHelper<Qt::MouseButton,_4>)(QFlagsStorage<Qt::MouseButton>)0x0;
  local_40.target = (QWindow *)0x0;
  local_40.deviceId = deviceId;
  QtPrivate::QMovableArrayOps<QGuiApplicationPrivate::TabletPointData>::
  emplace<QGuiApplicationPrivate::TabletPointData>
            ((QMovableArrayOps<QGuiApplicationPrivate::TabletPointData> *)&tabletDevicePoints,i,
             &local_40);
  QList<QGuiApplicationPrivate::TabletPointData>::end(&tabletDevicePoints);
  iVar2 = QList<QGuiApplicationPrivate::TabletPointData>::end(&tabletDevicePoints);
  pTVar3 = iVar2.i + -1;
LAB_002d6b75:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return pTVar3;
}

Assistant:

QGuiApplicationPrivate::TabletPointData &QGuiApplicationPrivate::tabletDevicePoint(qint64 deviceId)
{
    for (int i = 0; i < tabletDevicePoints.size(); ++i) {
        TabletPointData &pointData = tabletDevicePoints[i];
        if (pointData.deviceId == deviceId)
            return pointData;
    }

    tabletDevicePoints.append(TabletPointData(deviceId));
    return tabletDevicePoints.last();
}